

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bottlecreatorgenerator.cpp
# Opt level: O2

void __thiscall
BottleCreatorGenerator::BottleCreatorGenerator
          (BottleCreatorGenerator *this,int numFields,double *rate_,bool toRos)

{
  double dVar1;
  ostream *poVar2;
  
  YarpCodeGenerator::YarpCodeGenerator(&this->super_YarpCodeGenerator);
  (this->super_YarpCodeGenerator)._vptr_YarpCodeGenerator =
       (_func_int **)&PTR_generateCode_abi_cxx11__0011eb70;
  this->numFields_ = numFields;
  this->listIndex_ = 0;
  this->toRos_ = toRos;
  (this->children_).super__Vector_base<ChildGenerator,_std::allocator<ChildGenerator>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children_).super__Vector_base<ChildGenerator,_std::allocator<ChildGenerator>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children_).super__Vector_base<ChildGenerator,_std::allocator<ChildGenerator>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fieldsType_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fieldsType_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fieldsType_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fieldsMsg_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fieldsMsg_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fieldsMsg_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fieldsMux_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fieldsMux_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fieldsMux_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = *rate_;
  this->rate = dVar1;
  this->period = 1.0 / dVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"Creating BottleCreatorGenerator.");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

BottleCreatorGenerator::BottleCreatorGenerator(int numFields, const double & rate_, bool toRos) :
    numFields_(numFields),
    rate(rate_),
    period(1/rate),
    listIndex_(0),
    toRos_(toRos) {
    std::cout << "Creating BottleCreatorGenerator." << std::endl;
}